

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusproxy.h
# Opt level: O1

QIBusProxy * __thiscall QIBusProxy::GetProperty(QIBusProxy *this,QString method)

{
  bool bVar1;
  char cVar2;
  QDBusMessage *this_00;
  QString *in_RDX;
  long in_FS_OFFSET;
  bool bVar3;
  QDBusMessage msg;
  QString local_e8;
  QString local_d0;
  long local_b8;
  QArrayData *local_b0;
  long local_a0;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  QArrayData *local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QDBusAbstractInterface::isValid();
  bVar3 = true;
  if ((cVar2 == '\0') || (QDBusAbstractInterface::service(), local_a0 == 0)) {
    bVar1 = false;
  }
  else {
    QDBusAbstractInterface::path();
    bVar3 = local_b8 == 0;
    bVar1 = true;
  }
  if ((bVar1) && ((QArrayData *)local_d0.d.ptr != (QArrayData *)0x0)) {
    LOCK();
    (((QBasicAtomicInt *)local_d0.d.ptr)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d0.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d0.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d0.d.ptr,2,0x10);
    }
  }
  if ((cVar2 != '\0') && (local_b0 != (QArrayData *)0x0)) {
    LOCK();
    (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b0,2,0x10);
    }
  }
  if (bVar3) {
    QDBusAbstractInterface::lastError();
    QDBusPendingCall::fromError((QDBusError *)this);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
    if ((QArrayData *)local_78._8_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_78._8_8_ = *(int *)local_78._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_78._8_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_78._8_8_,2,0x10);
      }
    }
  }
  else {
    local_d0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    QDBusAbstractInterface::service();
    QDBusAbstractInterface::path();
    local_e8.d.d = (Data *)0x0;
    local_e8.d.ptr = L"org.freedesktop.DBus.Properties";
    local_e8.d.size = 0x1f;
    QDBusMessage::createMethodCall(&local_d0,(QString *)&local_78,(QString *)&local_98,&local_e8);
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_98.shared = *(int *)local_98.shared + -1;
      UNLOCK();
      if (*(int *)local_98.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_98.shared,2,0x10);
      }
    }
    if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_78.shared = *(int *)local_78.shared + -1;
      UNLOCK();
      if (*(int *)local_78.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_78.shared,2,0x10);
      }
    }
    QDBusAbstractInterface::interface();
    QVariant::QVariant((QVariant *)&local_78,&local_e8);
    this_00 = (QDBusMessage *)
              QDBusMessage::operator<<((QDBusMessage *)&local_d0,(QVariant *)&local_78);
    QVariant::QVariant((QVariant *)&local_98,in_RDX);
    QDBusMessage::operator<<(this_00,(QVariant *)&local_98);
    QVariant::~QVariant((QVariant *)&local_98);
    QVariant::~QVariant((QVariant *)&local_78);
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QDBusAbstractInterface::connection();
    QDBusAbstractInterface::timeout();
    QDBusConnection::asyncCall((QDBusMessage *)this,(int)&local_78);
    QDBusConnection::~QDBusConnection((QDBusConnection *)local_78.data);
    QDBusMessage::~QDBusMessage((QDBusMessage *)&local_d0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

inline QDBusPendingCall GetProperty(const QString method)
    {
        if (!this->isValid() || this->service().isEmpty() || this->path().isEmpty())
             return QDBusPendingCall::fromError(this->lastError());

        QDBusMessage msg = QDBusMessage::createMethodCall(this->service(),
                                                          this->path(),
                                                          dbusInterfaceProperties(),
                                                          QStringLiteral("Get"));
        msg << this->interface() << method;
        return this->connection().asyncCall(msg, this->timeout());
    }